

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

unsigned_long pybind11::detail::as_unsigned<unsigned_long>(PyObject *o)

{
  unsigned_long uVar1;
  long lVar2;
  
  uVar1 = PyLong_AsUnsignedLong();
  if ((uVar1 == 0xffffffffffffffff) && (lVar2 = PyErr_Occurred(), lVar2 != 0)) {
    return 0xffffffffffffffff;
  }
  return uVar1;
}

Assistant:

Unsigned as_unsigned(PyObject *o) {
    if (sizeof(Unsigned) <= sizeof(unsigned long)
#if PY_VERSION_HEX < 0x03000000
            || PyInt_Check(o)
#endif
    ) {
        unsigned long v = PyLong_AsUnsignedLong(o);
        return v == (unsigned long) -1 && PyErr_Occurred() ? (Unsigned) -1 : (Unsigned) v;
    }
    else {
        unsigned long long v = PyLong_AsUnsignedLongLong(o);
        return v == (unsigned long long) -1 && PyErr_Occurred() ? (Unsigned) -1 : (Unsigned) v;
    }
}